

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O1

uint Curl_ipv6_scope(sockaddr *sa)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  if (sa->sa_family != 10) {
    return 0;
  }
  if ((sa->sa_data[6] & 0xfeU) == 0xfc) {
    uVar3 = 3;
  }
  else {
    bVar1 = sa->sa_data[7];
    uVar3 = (uint)bVar1;
    uVar4 = bVar1 & 0xffffffc0 | (uint)(byte)sa->sa_data[6] << 8;
    if (uVar4 == 0) {
      if ((((((((((((((sa->sa_data[8] != '\0' || sa->sa_data[9] != '\0') || sa->sa_data[10] != '\0')
                    || sa->sa_data[0xb] != '\0') || sa->sa_data[0xc] != '\0') ||
                  sa->sa_data[0xd] != '\0') || (char)sa[1].sa_family != '\0') ||
                *(char *)((long)&sa[1].sa_family + 1) != '\0') || sa[1].sa_data[0] != '\0') ||
              sa[1].sa_data[1] != '\0') || sa[1].sa_data[2] != '\0') || sa[1].sa_data[3] != '\0') ||
           sa[1].sa_data[4] != '\0') || bVar1 != 0) || (sa[1].sa_data[5] != '\x01')) {
LAB_005d51e5:
        bVar2 = true;
        goto LAB_005d51e7;
      }
      uVar3 = 4;
    }
    else if (uVar4 == 0xfe80) {
      uVar3 = 1;
    }
    else {
      if (uVar4 != 0xfec0) goto LAB_005d51e5;
      uVar3 = 2;
    }
  }
  bVar2 = false;
LAB_005d51e7:
  if (bVar2) {
    return 0;
  }
  return uVar3;
}

Assistant:

unsigned int Curl_ipv6_scope(const struct sockaddr *sa)
{
  if(sa->sa_family == AF_INET6) {
    const struct sockaddr_in6 * sa6 = (const struct sockaddr_in6 *)(void *) sa;
    const unsigned char *b = sa6->sin6_addr.s6_addr;
    unsigned short w = (unsigned short) ((b[0] << 8) | b[1]);

    if((b[0] & 0xFE) == 0xFC) /* Handle ULAs */
      return IPV6_SCOPE_UNIQUELOCAL;
    switch(w & 0xFFC0) {
    case 0xFE80:
      return IPV6_SCOPE_LINKLOCAL;
    case 0xFEC0:
      return IPV6_SCOPE_SITELOCAL;
    case 0x0000:
      w = b[1] | b[2] | b[3] | b[4] | b[5] | b[6] | b[7] | b[8] | b[9] |
          b[10] | b[11] | b[12] | b[13] | b[14];
      if(w || b[15] != 0x01)
        break;
      return IPV6_SCOPE_NODELOCAL;
    default:
      break;
    }
  }
  return IPV6_SCOPE_GLOBAL;
}